

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

Regexp * __thiscall duckdb_re2::Regexp::Incref(Regexp *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  mapped_type_conflict2 *pmVar4;
  undefined8 *in_FS_OFFSET;
  MutexLock l;
  MutexLock local_28;
  undefined8 local_20;
  
  if (this->ref_ < 0xfffe) {
    this->ref_ = this->ref_ + 1;
  }
  else {
    local_28.mu_ = (Mutex *)&stack0xffffffffffffffe0;
    puVar1 = (undefined8 *)*in_FS_OFFSET;
    *puVar1 = &local_28;
    puVar2 = (undefined8 *)*in_FS_OFFSET;
    *puVar2 = std::once_flag::_Prepare_execution::
              _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
              ::anon_class_1_0_00000001::__invoke;
    iVar3 = pthread_once(&Incref::ref_once._M_once,__once_proxy);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    *puVar1 = 0;
    *puVar2 = 0;
    MutexLock::MutexLock(&local_28,(Mutex *)ref_storage);
    local_20 = this;
    if (this->ref_ == 0xffff) {
      pmVar4 = std::
               map<duckdb_re2::Regexp_*,_int,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
               ::operator[]((map<duckdb_re2::Regexp_*,_int,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
                             *)(ref_storage + 0x38),(key_type *)&stack0xffffffffffffffe0);
      *pmVar4 = *pmVar4 + 1;
    }
    else {
      pmVar4 = std::
               map<duckdb_re2::Regexp_*,_int,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
               ::operator[]((map<duckdb_re2::Regexp_*,_int,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
                             *)(ref_storage + 0x38),(key_type *)&stack0xffffffffffffffe0);
      *pmVar4 = 0xffff;
      this->ref_ = 0xffff;
    }
    MutexLock::~MutexLock(&local_28);
  }
  return this;
}

Assistant:

Regexp* Regexp::Incref() {
  if (ref_ >= kMaxRef-1) {
    static std::once_flag ref_once;
    std::call_once(ref_once, []() {
      (void) new (ref_storage) RefStorage;
    });

    // Store ref count in overflow map.
    MutexLock l(ref_mutex());
    if (ref_ == kMaxRef) {
      // already overflowed
      (*ref_map())[this]++;
    } else {
      // overflowing now
      (*ref_map())[this] = kMaxRef;
      ref_ = kMaxRef;
    }
    return this;
  }

  ref_++;
  return this;
}